

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintexteditsearchwidget.cpp
# Opt level: O3

bool __thiscall QPlainTextEditSearchWidget::doReplace(QPlainTextEditSearchWidget *this,bool forAll)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  MoveMode MVar4;
  bool bVar5;
  QTextCursor cursor;
  QString text;
  QTextCursor local_70 [8];
  QRegularExpression local_68 [2];
  long local_58;
  QRegularExpression local_50;
  QArrayData *local_48;
  QArrayData *local_30 [3];
  
  cVar1 = QPlainTextEdit::isReadOnly();
  if (cVar1 != '\0') {
    return false;
  }
  QPlainTextEdit::textCursor();
  if (!forAll) {
    QTextCursor::selectedText();
    if (local_68[0].d.d != (QRegularExpressionPrivate *)0x0) {
      LOCK();
      *(int *)local_68[0].d.d = *(int *)local_68[0].d.d + -1;
      UNLOCK();
      if (*(int *)local_68[0].d.d == 0) {
        QArrayData::deallocate((QArrayData *)local_68[0].d.d,2,8);
      }
    }
    if (local_58 == 0) {
      bVar5 = false;
      goto LAB_00119aab;
    }
  }
  iVar3 = QComboBox::currentIndex();
  if (iVar3 == 2) {
    QTextCursor::selectedText();
    QLineEdit::text();
    QRegularExpression::QRegularExpression(&local_50,local_30,0);
    QLineEdit::text();
    QString::replace(local_68,(QString *)&local_50);
    if (local_48 != (QArrayData *)0x0) {
      LOCK();
      (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48,2,8);
      }
    }
    QRegularExpression::~QRegularExpression(&local_50);
    if (local_30[0] != (QArrayData *)0x0) {
      LOCK();
      (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_30[0],2,8);
      }
    }
    QTextCursor::insertText((QString *)local_70);
  }
  else {
    QLineEdit::text();
    QTextCursor::insertText((QString *)local_70);
  }
  if (local_68[0].d.d != (QRegularExpressionPrivate *)0x0) {
    LOCK();
    *(int *)local_68[0].d.d = *(int *)local_68[0].d.d + -1;
    UNLOCK();
    if (*(int *)local_68[0].d.d == 0) {
      QArrayData::deallocate((QArrayData *)local_68[0].d.d,2,8);
    }
  }
  bVar5 = true;
  if (!forAll) {
    MVar4 = QTextCursor::position();
    bVar2 = doSearch(this,true,true,true);
    if (!bVar2) {
      QTextCursor::setPosition((int)local_70,MVar4);
      QPlainTextEdit::setTextCursor(*(QTextCursor **)(this + 0x88));
    }
  }
LAB_00119aab:
  QTextCursor::~QTextCursor(local_70);
  return bVar5;
}

Assistant:

bool QPlainTextEditSearchWidget::doReplace(bool forAll) {
    if (_textEdit->isReadOnly()) {
        return false;
    }

    QTextCursor cursor = _textEdit->textCursor();

    if (!forAll && cursor.selectedText().isEmpty()) {
        return false;
    }

    const int searchMode = ui->modeComboBox->currentIndex();
    if (searchMode == RegularExpressionMode) {
        QString text = cursor.selectedText();
        text.replace(QRegularExpression(ui->searchLineEdit->text()),
                     ui->replaceLineEdit->text());
        cursor.insertText(text);
    } else {
        cursor.insertText(ui->replaceLineEdit->text());
    }

    if (!forAll) {
        const int position = cursor.position();

        if (!doSearch(true)) {
            // restore the last cursor position if text wasn't found any more
            cursor.setPosition(position);
            _textEdit->setTextCursor(cursor);
        }
    }

    return true;
}